

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  SystemInformation *this_local;
  string *fqdn;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  SystemInformationImplementation::GetFullyQualifiedDomainName
            (this->Implementation,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetFullyQualifiedDomainName()
{
  std::string fqdn;
  this->Implementation->GetFullyQualifiedDomainName(fqdn);
  return fqdn;
}